

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<EnumNameValue>::Inserter::insertOne
          (Inserter *this,qsizetype pos,EnumNameValue *t)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  EnumNameValue *pEVar3;
  qsizetype qVar4;
  EnumNameValue *pEVar5;
  undefined8 uVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  
  pEVar3 = this->begin;
  lVar11 = this->size;
  pEVar5 = pEVar3 + lVar11;
  this->end = pEVar5;
  this->last = pEVar3 + lVar11 + -1;
  this->where = pEVar3 + pos;
  lVar11 = lVar11 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar11;
  this->sourceCopyAssign = 1;
  if (0 < lVar11) {
    pDVar7 = pEVar5[-1].name.d.d;
    pcVar8 = pEVar5[-1].name.d.ptr;
    pEVar5[-1].name.d.d = (Data *)0x0;
    pEVar5[-1].name.d.ptr = (char16_t *)0x0;
    (pEVar5->name).d.d = pDVar7;
    (pEVar5->name).d.ptr = pcVar8;
    qVar4 = pEVar5[-1].name.d.size;
    pEVar5[-1].name.d.size = 0;
    (pEVar5->name).d.size = qVar4;
    pDVar7 = pEVar5[-1].valueStr.d.d;
    pcVar8 = pEVar5[-1].valueStr.d.ptr;
    pEVar5[-1].valueStr.d.d = (Data *)0x0;
    pEVar5[-1].valueStr.d.ptr = (char16_t *)0x0;
    (pEVar5->valueStr).d.d = pDVar7;
    (pEVar5->valueStr).d.ptr = pcVar8;
    qVar4 = pEVar5[-1].valueStr.d.size;
    pEVar5[-1].valueStr.d.size = 0;
    (pEVar5->valueStr).d.size = qVar4;
    pEVar5->value = pEVar5[-1].value;
    this->size = this->size + 1;
    if (this->move != 0) {
      lVar11 = 0;
      lVar12 = 0;
      do {
        pEVar5 = this->last;
        puVar2 = (undefined8 *)((long)&(pEVar5->name).d.d + lVar11);
        uVar6 = *puVar2;
        uVar9 = puVar2[1];
        puVar1 = (undefined8 *)((long)&pEVar5[-1].name.d.d + lVar11);
        uVar10 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pEVar5->name).d.d + lVar11);
        *puVar2 = *puVar1;
        puVar2[1] = uVar10;
        puVar2 = (undefined8 *)((long)&pEVar5[-1].name.d.d + lVar11);
        *puVar2 = uVar6;
        puVar2[1] = uVar9;
        uVar6 = *(undefined8 *)((long)&(pEVar5->name).d.size + lVar11);
        *(undefined8 *)((long)&(pEVar5->name).d.size + lVar11) =
             *(undefined8 *)((long)pEVar5 + lVar11 + -0x28);
        *(undefined8 *)((long)pEVar5 + lVar11 + -0x28) = uVar6;
        puVar2 = (undefined8 *)((long)&(pEVar5->valueStr).d.d + lVar11);
        uVar6 = *puVar2;
        uVar9 = puVar2[1];
        puVar2 = (undefined8 *)((long)pEVar5 + lVar11 + -0x20);
        uVar10 = puVar2[1];
        puVar1 = (undefined8 *)((long)&(pEVar5->valueStr).d.d + lVar11);
        *puVar1 = *puVar2;
        puVar1[1] = uVar10;
        puVar2 = (undefined8 *)((long)pEVar5 + lVar11 + -0x20);
        *puVar2 = uVar6;
        puVar2[1] = uVar9;
        uVar6 = *(undefined8 *)((long)&(pEVar5->valueStr).d.size + lVar11);
        *(undefined8 *)((long)&(pEVar5->valueStr).d.size + lVar11) =
             *(undefined8 *)((long)pEVar5 + lVar11 + -0x10);
        *(undefined8 *)((long)pEVar5 + lVar11 + -0x10) = uVar6;
        *(undefined4 *)((long)&pEVar5->value + lVar11) = *(undefined4 *)((long)pEVar5 + lVar11 + -8)
        ;
        lVar12 = lVar12 + -1;
        lVar11 = lVar11 + -0x38;
      } while (lVar12 != this->move);
    }
    pEVar5 = this->where;
    pDVar7 = (pEVar5->name).d.d;
    (pEVar5->name).d.d = (t->name).d.d;
    (t->name).d.d = pDVar7;
    pcVar8 = (pEVar5->name).d.ptr;
    (pEVar5->name).d.ptr = (t->name).d.ptr;
    (t->name).d.ptr = pcVar8;
    qVar4 = (pEVar5->name).d.size;
    (pEVar5->name).d.size = (t->name).d.size;
    (t->name).d.size = qVar4;
    pDVar7 = (pEVar5->valueStr).d.d;
    (pEVar5->valueStr).d.d = (t->valueStr).d.d;
    (t->valueStr).d.d = pDVar7;
    pcVar8 = (pEVar5->valueStr).d.ptr;
    (pEVar5->valueStr).d.ptr = (t->valueStr).d.ptr;
    (t->valueStr).d.ptr = pcVar8;
    qVar4 = (pEVar5->valueStr).d.size;
    (pEVar5->valueStr).d.size = (t->valueStr).d.size;
    (t->valueStr).d.size = qVar4;
    pEVar5->value = t->value;
    return;
  }
  this->sourceCopyConstruct = 1 - lVar11;
  this->move = 0;
  this->sourceCopyAssign = lVar11;
  pDVar7 = (t->name).d.d;
  (t->name).d.d = (Data *)0x0;
  (pEVar5->name).d.d = pDVar7;
  pcVar8 = (t->name).d.ptr;
  (t->name).d.ptr = (char16_t *)0x0;
  (pEVar5->name).d.ptr = pcVar8;
  qVar4 = (t->name).d.size;
  (t->name).d.size = 0;
  (pEVar5->name).d.size = qVar4;
  pDVar7 = (t->valueStr).d.d;
  (t->valueStr).d.d = (Data *)0x0;
  (pEVar5->valueStr).d.d = pDVar7;
  pcVar8 = (t->valueStr).d.ptr;
  (t->valueStr).d.ptr = (char16_t *)0x0;
  (pEVar5->valueStr).d.ptr = pcVar8;
  qVar4 = (t->valueStr).d.size;
  (t->valueStr).d.size = 0;
  (pEVar5->valueStr).d.size = qVar4;
  pEVar5->value = t->value;
  this->size = this->size + 1;
  return;
}

Assistant:

void setup(qsizetype pos, qsizetype n)
        {
            end = begin + size;
            last = end - 1;
            where = begin + pos;
            qsizetype dist = size - pos;
            sourceCopyConstruct = 0;
            nSource = n;
            move = n - dist; // smaller 0
            sourceCopyAssign = n;
            if (n > dist) {
                sourceCopyConstruct = n - dist;
                move = 0;
                sourceCopyAssign -= sourceCopyConstruct;
            }
        }